

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp4::sPolynomial19
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x201];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x300];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x220] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x21a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x319] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2b6] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2b0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2cf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2c9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x332] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2e8] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2e2] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x34b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x301] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2fb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x364] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x31a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x314] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x37d] / dVar2;
  dVar3 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x346];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x333] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x32d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x34c] = dVar3 / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x365] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x35f] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x37e] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x378] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x396] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x397] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x391] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::sPolynomial19( Eigen::Matrix<double,25,37> & groebnerMatrix )
{
  groebnerMatrix(19,21) = (groebnerMatrix(13,21)/(groebnerMatrix(13,20))-groebnerMatrix(18,31)/(groebnerMatrix(18,30)));
  groebnerMatrix(19,27) = groebnerMatrix(13,27)/(groebnerMatrix(13,20));
  groebnerMatrix(19,28) = (groebnerMatrix(13,28)/(groebnerMatrix(13,20))-groebnerMatrix(18,32)/(groebnerMatrix(18,30)));
  groebnerMatrix(19,29) = (groebnerMatrix(13,29)/(groebnerMatrix(13,20))-groebnerMatrix(18,33)/(groebnerMatrix(18,30)));
  groebnerMatrix(19,30) = (groebnerMatrix(13,30)/(groebnerMatrix(13,20))-groebnerMatrix(18,34)/(groebnerMatrix(18,30)));
  groebnerMatrix(19,31) = (groebnerMatrix(13,31)/(groebnerMatrix(13,20))-groebnerMatrix(18,35)/(groebnerMatrix(18,30)));
  groebnerMatrix(19,32) = groebnerMatrix(13,32)/(groebnerMatrix(13,20));
  groebnerMatrix(19,33) = groebnerMatrix(13,33)/(groebnerMatrix(13,20));
  groebnerMatrix(19,34) = groebnerMatrix(13,34)/(groebnerMatrix(13,20));
  groebnerMatrix(19,35) = (groebnerMatrix(13,35)/(groebnerMatrix(13,20))-groebnerMatrix(18,36)/(groebnerMatrix(18,30)));
  groebnerMatrix(19,36) = groebnerMatrix(13,36)/(groebnerMatrix(13,20));
}